

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

ostream * operator<<(ostream *os,cmListFileContext *lfc)

{
  ostream *poVar1;
  ulong uVar2;
  cmListFileContext *lfc_local;
  ostream *os_local;
  
  std::operator<<(os,(string *)&lfc->FilePath);
  if (lfc->Line != 0) {
    poVar1 = std::operator<<(os,":");
    std::ostream::operator<<(poVar1,lfc->Line);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      poVar1 = std::operator<<(os," (");
      poVar1 = std::operator<<(poVar1,(string *)lfc);
      std::operator<<(poVar1,")");
    }
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, cmListFileContext const& lfc)
{
  os << lfc.FilePath;
  if (lfc.Line) {
    os << ":" << lfc.Line;
    if (!lfc.Name.empty()) {
      os << " (" << lfc.Name << ")";
    }
  }
  return os;
}